

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall Lexer::Lexify(Lexer *this,char *code)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined1 local_90 [8];
  Lexeme lex;
  Lexeme lex_1;
  char *pos_3;
  char *pos_2;
  char *pcStack_38;
  uint depth;
  char *pos_1;
  char *pos;
  int lLength;
  LexemeType lType;
  char *lineStart;
  char *code_local;
  Lexer *this_local;
  
  SmallArray<Lexeme,_32U>::reserve(&this->lexems,0x800);
  this->line = 0;
  _lLength = code;
  lineStart = code;
LAB_002895ff:
  pos._4_4_ = 0;
  pos._0_4_ = 1;
  iVar4 = (int)lineStart;
  if (*lineStart == '\0') {
    local_90._0_4_ = lex_none;
    lex.pos._0_4_ = 1;
    lex._0_8_ = lineStart;
    lex.pos._4_4_ = this->line;
    lex.length = iVar4 - (int)_lLength;
    SmallArray<Lexeme,_32U>::push_back(&this->lexems,(Lexeme *)local_90);
    return;
  }
  switch(*lineStart) {
  case '\t':
  case ' ':
    do {
      lineStart = lineStart + 1;
      bVar2 = false;
      if (((byte)(*lineStart - 1U) < 0x20) && (bVar2 = false, *lineStart != '\r')) {
        bVar2 = *lineStart != '\n';
      }
    } while (bVar2);
    goto LAB_002895ff;
  case '\n':
    _lLength = lineStart + 1;
    this->line = this->line + 1;
    lineStart = _lLength;
    goto LAB_002895ff;
  default:
    bVar2 = isDigit(*lineStart);
    if (bVar2) {
      pos._4_4_ = 1;
      pos_3 = lineStart;
      if ((*lineStart == '0') && (lineStart[1] == 'x')) {
        pos_3 = lineStart + 2;
        while( true ) {
          bVar3 = isDigit(*pos_3);
          bVar2 = true;
          if ((!bVar3) && (bVar2 = false, '@' < (char)(*pos_3 & 0xdfU))) {
            bVar2 = (char)(*pos_3 & 0xdfU) < 'G';
          }
          if (!bVar2) break;
          pos_3 = pos_3 + 1;
        }
      }
      else {
        while (bVar2 = isDigit(*pos_3), bVar2) {
          pos_3 = pos_3 + 1;
        }
      }
      if (*pos_3 == '.') {
        pos_3 = pos_3 + 1;
      }
      while (bVar2 = isDigit(*pos_3), bVar2) {
        pos_3 = pos_3 + 1;
      }
      pcVar1 = pos_3;
      if ((*pos_3 == 'e') && (pcVar1 = pos_3 + 1, pos_3[1] == '-')) {
        pcVar1 = pos_3 + 2;
      }
      while (pos_3 = pcVar1, bVar2 = isDigit(*pos_3), bVar2) {
        pcVar1 = pos_3 + 1;
      }
      pos._0_4_ = (int)pos_3 - iVar4;
    }
    else if ((""[(byte)*lineStart] & 0x80) != 0) {
      lex_1._24_8_ = lineStart;
      while ((""[*(byte *)lex_1._24_8_] & 0x40) != 0) {
        lex_1._24_8_ = lex_1._24_8_ + 1;
      }
      pos._0_4_ = lex_1.column - iVar4;
      if ((""[*(byte *)lex_1._24_8_] & 0x40) == 0) {
        switch((int)pos) {
        case 2:
          if (*(short *)lineStart == 0x6669) {
            pos._4_4_ = 0x35;
          }
          else if (*(short *)lineStart == 0x6e69) {
            pos._4_4_ = 0x1d;
          }
          else if (*(short *)lineStart == 0x6f64) {
            pos._4_4_ = 0x39;
          }
          break;
        case 3:
          iVar4 = memcmp(lineStart,"for",3);
          if (iVar4 == 0) {
            pos._4_4_ = 0x37;
          }
          else {
            iVar4 = memcmp(lineStart,"ref",3);
            if (iVar4 == 0) {
              pos._4_4_ = 0x40;
            }
            else {
              iVar4 = memcmp(lineStart,"new",3);
              if (iVar4 == 0) {
                pos._4_4_ = 0x47;
              }
            }
          }
          break;
        case 4:
          if (*(int *)lineStart == 0x65736163) {
            pos._4_4_ = 0x3b;
          }
          else if (*(int *)lineStart == 0x65736c65) {
            pos._4_4_ = 0x36;
          }
          else if (*(int *)lineStart == 0x6f747561) {
            pos._4_4_ = 0x41;
          }
          else if (*(int *)lineStart == 0x65757274) {
            pos._4_4_ = 0x51;
          }
          else if (*(int *)lineStart == 0x6d756e65) {
            pos._4_4_ = 0x53;
          }
          else if (*(int *)lineStart == 0x68746977) {
            pos._4_4_ = 0x56;
          }
          break;
        case 5:
          iVar4 = memcmp(lineStart,"while",5);
          if (iVar4 == 0) {
            pos._4_4_ = 0x38;
          }
          else {
            iVar4 = memcmp(lineStart,"break",5);
            if (iVar4 == 0) {
              pos._4_4_ = 0x3d;
            }
            else {
              iVar4 = memcmp(lineStart,"class",5);
              if (iVar4 == 0) {
                pos._4_4_ = 0x42;
              }
              else {
                iVar4 = memcmp(lineStart,"align",5);
                if (iVar4 == 0) {
                  pos._4_4_ = 0x44;
                }
                else {
                  iVar4 = memcmp(lineStart,"yield",5);
                  if (iVar4 == 0) {
                    pos._4_4_ = 0x4d;
                  }
                  else {
                    iVar4 = memcmp(lineStart,"const",5);
                    if (iVar4 == 0) {
                      pos._4_4_ = 0x50;
                    }
                    else {
                      iVar4 = memcmp(lineStart,"false",5);
                      if (iVar4 == 0) {
                        pos._4_4_ = 0x52;
                      }
                    }
                  }
                }
              }
            }
          }
          break;
        case 6:
          iVar4 = memcmp(lineStart,"switch",6);
          if (iVar4 == 0) {
            pos._4_4_ = 0x3a;
          }
          else {
            iVar4 = memcmp(lineStart,"return",6);
            if (iVar4 == 0) {
              pos._4_4_ = 0x3f;
            }
            else {
              iVar4 = memcmp(lineStart,"typeof",6);
              if (iVar4 == 0) {
                pos._4_4_ = 0x45;
              }
              else {
                iVar4 = memcmp(lineStart,"sizeof",6);
                if (iVar4 == 0) {
                  pos._4_4_ = 0x46;
                }
                else {
                  iVar4 = memcmp(lineStart,"import",6);
                  if (iVar4 == 0) {
                    pos._4_4_ = 0x4a;
                  }
                }
              }
            }
          }
          break;
        case 7:
          iVar4 = memcmp(lineStart,"noalign",7);
          if (iVar4 == 0) {
            pos._4_4_ = 0x43;
          }
          else {
            iVar4 = memcmp(lineStart,"default",7);
            if (iVar4 == 0) {
              pos._4_4_ = 0x3c;
            }
            else {
              iVar4 = memcmp(lineStart,"typedef",7);
              if (iVar4 == 0) {
                pos._4_4_ = 0x49;
              }
              else {
                iVar4 = memcmp(lineStart,"nullptr",7);
                if (iVar4 == 0) {
                  pos._4_4_ = 0x4b;
                }
                else {
                  iVar4 = memcmp(lineStart,"generic",7);
                  if (iVar4 == 0) {
                    pos._4_4_ = 0x4f;
                  }
                }
              }
            }
          }
          break;
        case 8:
          if (*(long *)lineStart == 0x65756e69746e6f63) {
            pos._4_4_ = 0x3e;
          }
          else if (*(long *)lineStart == 0x726f74617265706f) {
            pos._4_4_ = 0x48;
          }
          break;
        case 9:
          iVar4 = memcmp(lineStart,"coroutine",9);
          if (iVar4 == 0) {
            pos._4_4_ = 0x4c;
          }
          else {
            iVar4 = memcmp(lineStart,"namespace",9);
            if (iVar4 == 0) {
              pos._4_4_ = 0x54;
            }
          }
          break;
        case 10:
          iVar4 = memcmp(lineStart,"extendable",10);
          if (iVar4 == 0) {
            pos._4_4_ = 0x55;
          }
        }
      }
      if (pos._4_4_ == 0) {
        pos._4_4_ = 2;
      }
    }
    break;
  case '\r':
    pcVar1 = lineStart + 1;
    if (lineStart[1] == '\n') {
      pcVar1 = lineStart + 2;
    }
    lineStart = pcVar1;
    _lLength = lineStart;
    this->line = this->line + 1;
    goto LAB_002895ff;
  case '!':
    pos._4_4_ = 0x2b;
    if (lineStart[1] == '=') {
      pos._4_4_ = 0x16;
      pos._0_4_ = 2;
    }
    break;
  case '\"':
    pos._4_4_ = 3;
    pos_1 = lineStart + 1;
    while( true ) {
      bVar2 = false;
      if (*pos_1 != '\0') {
        bVar2 = *pos_1 != '\"';
      }
      if (!bVar2) break;
      if ((*pos_1 == '\\') && (pos_1[1] != '\0')) {
        pos_1 = pos_1 + 2;
      }
      else if (*pos_1 == '\r') {
        pcVar1 = pos_1 + 1;
        if (pos_1[1] == '\n') {
          pcVar1 = pos_1 + 2;
        }
        pos_1 = pcVar1;
        _lLength = pos_1;
        this->line = this->line + 1;
      }
      else {
        if (*pos_1 == '\n') {
          _lLength = pos_1 + 1;
          this->line = this->line + 1;
        }
        pos_1 = pos_1 + 1;
      }
    }
    if (*pos_1 != '\0') {
      pos_1 = pos_1 + 1;
    }
    pos._0_4_ = (int)pos_1 - iVar4;
    break;
  case '%':
    pos._4_4_ = 0xd;
    if (lineStart[1] == '=') {
      pos._4_4_ = 0x24;
      pos._0_4_ = 2;
    }
    break;
  case '&':
    pos._4_4_ = 0x17;
    if (lineStart[1] == '&') {
      pos._4_4_ = 0x1a;
      pos._0_4_ = 2;
    }
    else if (lineStart[1] == '=') {
      pos._4_4_ = 0x27;
      pos._0_4_ = 2;
    }
    break;
  case '\'':
    pos._4_4_ = 4;
    pcStack_38 = lineStart + 1;
    while( true ) {
      bVar2 = false;
      if (*pcStack_38 != '\0') {
        bVar2 = *pcStack_38 != '\'';
      }
      if (!bVar2) break;
      if ((*pcStack_38 == '\\') && (pcStack_38[1] != '\0')) {
        pcStack_38 = pcStack_38 + 2;
      }
      else if (*pcStack_38 == '\r') {
        pcVar1 = pcStack_38 + 1;
        if (pcStack_38[1] == '\n') {
          pcVar1 = pcStack_38 + 2;
        }
        pcStack_38 = pcVar1;
        _lLength = pcStack_38;
        this->line = this->line + 1;
      }
      else {
        if (*pcStack_38 == '\n') {
          _lLength = pcStack_38 + 1;
          this->line = this->line + 1;
        }
        pcStack_38 = pcStack_38 + 1;
      }
    }
    if (*pcStack_38 != '\0') {
      pcStack_38 = pcStack_38 + 1;
    }
    pos._0_4_ = (int)pcStack_38 - iVar4;
    break;
  case '(':
    pos._4_4_ = 0x2c;
    break;
  case ')':
    pos._4_4_ = 0x2d;
    break;
  case '*':
    pos._4_4_ = 0xb;
    if (lineStart[1] == '=') {
      pos._4_4_ = 0x21;
      pos._0_4_ = 2;
    }
    else if (lineStart[1] == '*') {
      pos._4_4_ = 0xe;
      pos._0_4_ = 2;
      if (lineStart[2] == '=') {
        pos._4_4_ = 0x23;
        pos._0_4_ = 3;
      }
    }
    break;
  case '+':
    pos._4_4_ = 9;
    if (lineStart[1] == '=') {
      pos._4_4_ = 0x1f;
      pos._0_4_ = 2;
    }
    else if (lineStart[1] == '+') {
      pos._4_4_ = 7;
      pos._0_4_ = 2;
    }
    break;
  case ',':
    pos._4_4_ = 6;
    break;
  case '-':
    pos._4_4_ = 10;
    if (lineStart[1] == '=') {
      pos._4_4_ = 0x20;
      pos._0_4_ = 2;
    }
    else if (lineStart[1] == '-') {
      pos._4_4_ = 8;
      pos._0_4_ = 2;
    }
    break;
  case '.':
    pos._4_4_ = 5;
    break;
  case '/':
    if (lineStart[1] == '=') {
      pos._4_4_ = 0x22;
      pos._0_4_ = 2;
      break;
    }
    if (lineStart[1] == '/') {
      while( true ) {
        bVar2 = false;
        if (*lineStart != '\n') {
          bVar2 = *lineStart != '\0';
        }
        if (!bVar2) break;
        lineStart = lineStart + 1;
      }
    }
    else {
      if (lineStart[1] != '*') {
        pos._4_4_ = 0xc;
        break;
      }
      lineStart = lineStart + 2;
      pos_2._4_4_ = 1;
      while (*lineStart != '\0' && pos_2._4_4_ != 0) {
        if ((*lineStart == '*') && (lineStart[1] == '/')) {
          lineStart = lineStart + 2;
          pos_2._4_4_ = pos_2._4_4_ + -1;
        }
        else if ((*lineStart == '/') && (lineStart[1] == '*')) {
          lineStart = lineStart + 2;
          pos_2._4_4_ = pos_2._4_4_ + 1;
        }
        else if (*lineStart == '\"') {
          lineStart = lineStart + 1;
          while( true ) {
            bVar2 = false;
            if (*lineStart != '\0') {
              bVar2 = *lineStart != '\"';
            }
            if (!bVar2) break;
            if ((*lineStart == '\\') && (lineStart[1] != '\0')) {
              lineStart = lineStart + 2;
            }
            else if (*lineStart == '\r') {
              pcVar1 = lineStart + 1;
              if (lineStart[1] == '\n') {
                pcVar1 = lineStart + 2;
              }
              lineStart = pcVar1;
              _lLength = lineStart;
              this->line = this->line + 1;
            }
            else {
              if (*lineStart == '\n') {
                _lLength = lineStart + 1;
                this->line = this->line + 1;
              }
              lineStart = lineStart + 1;
            }
          }
          if (*lineStart == '\"') {
            lineStart = lineStart + 1;
          }
        }
        else if (*lineStart == '\r') {
          pcVar1 = lineStart + 1;
          if (lineStart[1] == '\n') {
            pcVar1 = lineStart + 2;
          }
          lineStart = pcVar1;
          _lLength = lineStart;
          this->line = this->line + 1;
        }
        else {
          if (*lineStart == '\n') {
            _lLength = lineStart + 1;
            this->line = this->line + 1;
          }
          lineStart = lineStart + 1;
        }
      }
    }
    goto LAB_002895ff;
  case ':':
    pos._4_4_ = 0x33;
    break;
  case ';':
    pos._4_4_ = 0x34;
    break;
  case '<':
    pos._4_4_ = 0xf;
    if (lineStart[1] == '=') {
      pos._4_4_ = 0x10;
      pos._0_4_ = 2;
    }
    else if (lineStart[1] == '<') {
      pos._4_4_ = 0x11;
      pos._0_4_ = 2;
      if (lineStart[2] == '=') {
        pos._4_4_ = 0x25;
        pos._0_4_ = 3;
      }
    }
    break;
  case '=':
    pos._4_4_ = 0x1e;
    if (lineStart[1] == '=') {
      pos._4_4_ = 0x15;
      pos._0_4_ = 2;
    }
    break;
  case '>':
    pos._4_4_ = 0x12;
    if (lineStart[1] == '=') {
      pos._4_4_ = 0x13;
      pos._0_4_ = 2;
    }
    else if (lineStart[1] == '>') {
      pos._4_4_ = 0x14;
      pos._0_4_ = 2;
      if (lineStart[2] == '=') {
        pos._4_4_ = 0x26;
        pos._0_4_ = 3;
      }
    }
    break;
  case '?':
    pos._4_4_ = 0x32;
    break;
  case '@':
    pos._4_4_ = 0x4e;
    break;
  case '[':
    pos._4_4_ = 0x2e;
    break;
  case ']':
    pos._4_4_ = 0x2f;
    break;
  case '^':
    pos._4_4_ = 0x19;
    if (lineStart[1] == '^') {
      pos._4_4_ = 0x1c;
      pos._0_4_ = 2;
    }
    else if (lineStart[1] == '=') {
      pos._4_4_ = 0x29;
      pos._0_4_ = 2;
    }
    break;
  case '{':
    pos._4_4_ = 0x30;
    break;
  case '|':
    pos._4_4_ = 0x18;
    if (lineStart[1] == '|') {
      pos._4_4_ = 0x1b;
      pos._0_4_ = 2;
    }
    else if (lineStart[1] == '=') {
      pos._4_4_ = 0x28;
      pos._0_4_ = 2;
    }
    break;
  case '}':
    pos._4_4_ = 0x31;
    break;
  case '~':
    pos._4_4_ = 0x2a;
  }
  lex.column = pos._4_4_;
  SmallArray<Lexeme,_32U>::push_back(&this->lexems,(Lexeme *)&lex.column);
  lineStart = lineStart + (int)pos;
  goto LAB_002895ff;
}

Assistant:

void Lexer::Lexify(const char* code)
{
	lexems.reserve(2048);

	const char *lineStart = code;
	line = 0;

	LexemeType lType = lex_none;
	int lLength = 1;

	while(*code)
	{
		switch(*code)
		{
		case '\r':
			code++;

			if(*code == '\n')
				code++;

			lineStart = code;
			line++;

			continue;
		case '\n':
			code++;

			lineStart = code;
			line++;

			continue;
		case ' ':
		case '\t':
			code++;
			while((unsigned char)(code[0] - 1) < ' ' && *code != '\r' && *code != '\n')
				code++;
			continue;
		case '\"':
			lType = lex_quotedstring;
			{
				const char *pos = code;
				pos++;

				while(*pos && *pos != '\"')
				{
					if(pos[0] == '\\' && pos[1])
					{
						pos += 2;
					}
					else if(pos[0] == '\r')
					{
						pos++;

						if(*pos == '\n')
							pos++;

						lineStart = pos;
						line++;
					}
					else if(pos[0] == '\n')
					{
						pos++;

						lineStart = pos;
						line++;
					}
					else
					{
						pos += 1;
					}
				}

				if(*pos)
					pos++;

				lLength = (int)(pos - code);
			}
			break;
		case '\'':
			lType = lex_semiquotedchar;
			{
				const char *pos = code;
				pos++;

				while(*pos && *pos != '\'')
				{
					if(pos[0] == '\\' && pos[1])
					{
						pos += 2;
					}
					else if(pos[0] == '\r')
					{
						pos++;

						if(*pos == '\n')
							pos++;

						lineStart = pos;
						line++;
					}
					else if(pos[0] == '\n')
					{
						pos++;

						lineStart = pos;
						line++;
					}
					else
					{
						pos += 1;
					}
				}

				if(*pos)
					pos++;

				lLength = (int)(pos - code);
			}
			break;
		case '.':
			lType = lex_point;
			break;
		case ',':
			lType = lex_comma;
			break;
		case '+':
			lType = lex_add;
			if(code[1] == '=')
			{
				lType = lex_addset;
				lLength = 2;
			}else if(code[1] == '+'){
				lType = lex_inc;
				lLength = 2;
			}
			break;
		case '-':
			lType = lex_sub;
			if(code[1] == '=')
			{
				lType = lex_subset;
				lLength = 2;
			}else if(code[1] == '-'){
				lType = lex_dec;
				lLength = 2;
			}
			break;
		case '*':
			lType = lex_mul;
			if(code[1] == '=')
			{
				lType = lex_mulset;
				lLength = 2;
			}else if(code[1] == '*'){
				lType = lex_pow;
				lLength = 2;
				if(code[2] == '=')
				{
					lType = lex_powset;
					lLength = 3;
				}
			}
			break;
		case '/':
			if(code[1] == '=')
			{
				lType = lex_divset;
				lLength = 2;
			}else if(code[1] == '/'){
				while(code[0] != '\n' && code[0] != '\0')
					code++;
				continue;
			}else if(code[1] == '*'){
				code += 2;
				unsigned depth = 1;
				while(*code && depth)
				{
					if(code[0] == '*' && code[1] == '/')
					{
						code += 2;
						depth--;
					}
					else if(code[0] == '/' && code[1] == '*')
					{
						code += 2;
						depth++;
					}
					else if(code[0] == '\"')
					{
						code++;

						while(code[0] && code[0] != '\"')
						{
							if(code[0] == '\\' && code[1])
							{
								code += 2;
							}
							else if(code[0] == '\r')
							{
								code++;

								if(*code == '\n')
									code++;

								lineStart = code;
								line++;
							}
							else if(code[0] == '\n')
							{
								code++;

								lineStart = code;
								line++;
							}
							else
							{
								code += 1;
							}
						}

						if(code[0] == '\"')
							code++;
					}
					else if(code[0] == '\r')
					{
						code++;

						if(*code == '\n')
							code++;

						lineStart = code;
						line++;
					}
					else if(code[0] == '\n')
					{
						code++;

						lineStart = code;
						line++;
					}
					else
					{
						code++;
					}
				}
				continue;
			}else{
				lType = lex_div;
			}
			break;
		case '%':
			lType = lex_mod;
			if(code[1] == '=')
			{
				lType = lex_modset;
				lLength = 2;
			}
			break;
		case '<':
			lType = lex_less;
			if(code[1] == '=')
			{
				lType = lex_lequal;
				lLength = 2;
			}else if(code[1] == '<'){
				lType = lex_shl;
				lLength = 2;
				if(code[2] == '=')
				{
					lType = lex_shlset;
					lLength = 3;
				}
			}
			break;
		case '>':
			lType = lex_greater;
			if(code[1] == '=')
			{
				lType = lex_gequal;
				lLength = 2;
			}else if(code[1] == '>'){
				lType = lex_shr;
				lLength = 2;
				if(code[2] == '=')
				{
					lType = lex_shrset;
					lLength = 3;
				}
			}
			break;
		case '=':
			lType = lex_set;
			if(code[1] == '=')
			{
				lType = lex_equal;
				lLength = 2;
			}
			break;
		case '!':
			lType = lex_lognot;
			if(code[1] == '=')
			{
				lType = lex_nequal;
				lLength = 2;
			}
			break;
		case '@':
			lType = lex_at;
			break;
		case '~':
			lType = lex_bitnot;
			break;
		case '&':
			lType = lex_bitand;
			if(code[1] == '&')
			{
				lType = lex_logand;
				lLength = 2;
			}else if(code[1] == '='){
				lType = lex_andset;
				lLength = 2;
			}
			break;
		case '|':
			lType = lex_bitor;
			if(code[1] == '|')
			{
				lType = lex_logor;
				lLength = 2;
			}else if(code[1] == '='){
				lType = lex_orset;
				lLength = 2;
			}
			break;
		case '^':
			lType = lex_bitxor;
			if(code[1] == '^')
			{
				lType = lex_logxor;
				lLength = 2;
			}else if(code[1] == '='){
				lType = lex_xorset;
				lLength = 2;
			}
			break;
		case '(':
			lType = lex_oparen;
			break;
		case ')':
			lType = lex_cparen;
			break;
		case '[':
			lType = lex_obracket;
			break;
		case ']':
			lType = lex_cbracket;
			break;
		case '{':
			lType = lex_ofigure;
			break;
		case '}':
			lType = lex_cfigure;
			break;
		case '?':
			lType = lex_questionmark;
			break;
		case ':':
			lType = lex_colon;
			break;
		case ';':
			lType = lex_semicolon;
			break;
		default:
			if(isDigit(*code))
			{
				lType = lex_number;

				const char *pos = code;
				if(pos[0] == '0' && pos[1] == 'x')
				{
					pos += 2;
					while(isDigit(*pos) || ((*pos & ~0x20) >= 'A' && (*pos & ~0x20) <= 'F'))
						pos++;
				}else{
					while(isDigit(*pos))
						pos++;
				}
				if(*pos == '.')
					pos++;
				while(isDigit(*pos))
					pos++;
				if(*pos == 'e')
				{
					pos++;
					if(*pos == '-')
						pos++;
				}
				while(isDigit(*pos))
					pos++;
				lLength = (int)(pos - code);
			}else if(chartype_table[(unsigned char)*code] & ct_start_symbol){
				const char *pos = code;
				while(chartype_table[(unsigned char)*pos] & ct_symbol)
					pos++;
				lLength = (int)(pos - code);

				if(!(chartype_table[(unsigned char)*pos] & ct_symbol))
				{
					switch(lLength)
					{
					case 2:
						if(memcmp(code, "if", 2) == 0)
							lType = lex_if;
						else if(memcmp(code, "in", 2) == 0)
							lType = lex_in;
						else if(memcmp(code, "do", 2) == 0)
							lType = lex_do;
						break;
					case 3:
						if(memcmp(code, "for", 3) == 0)
							lType = lex_for;
						else if(memcmp(code, "ref", 3) == 0)
							lType = lex_ref;
						else if(memcmp(code, "new", 3) == 0)
							lType = lex_new;
						break;
					case 4:
						if(memcmp(code, "case", 4) == 0)
							lType = lex_case;
						else if(memcmp(code, "else", 4) == 0)
							lType = lex_else;
						else if(memcmp(code, "auto", 4) == 0)
							lType = lex_auto;
						else if(memcmp(code, "true", 4) == 0)
							lType = lex_true;
						else if(memcmp(code, "enum", 4) == 0)
							lType = lex_enum;
						else if(memcmp(code, "with", 4) == 0)
							lType = lex_with;
						break;
					case 5:
						if(memcmp(code, "while", 5) == 0)
							lType = lex_while;
						else if(memcmp(code, "break", 5) == 0)
							lType = lex_break;
						else if(memcmp(code, "class", 5) == 0)
							lType = lex_class;
						else if(memcmp(code, "align", 5) == 0)
							lType = lex_align;
						else if(memcmp(code, "yield", 5) == 0)
							lType = lex_yield;
						else if(memcmp(code, "const", 5) == 0)
							lType = lex_const;
						else if(memcmp(code, "false", 5) == 0)
							lType = lex_false;
						break;
					case 6:
						if(memcmp(code, "switch", 6) == 0)
							lType = lex_switch;
						else if(memcmp(code, "return", 6) == 0)
							lType = lex_return;
						else if(memcmp(code, "typeof", 6) == 0)
							lType = lex_typeof;
						else if(memcmp(code, "sizeof", 6) == 0)
							lType = lex_sizeof;
						else if(memcmp(code, "import", 6) == 0)
							lType = lex_import;
						break;
					case 7:
						if(memcmp(code, "noalign", 7) == 0)
							lType = lex_noalign;
						else if(memcmp(code, "default", 7) == 0)
							lType = lex_default;
						else if(memcmp(code, "typedef", 7) == 0)
							lType = lex_typedef;
						else if(memcmp(code, "nullptr", 7) == 0)
							lType = lex_nullptr;
						else if(memcmp(code, "generic", 7) == 0)
							lType = lex_generic;
						break;
					case 8:
						if(memcmp(code, "continue", 8) == 0)
							lType = lex_continue;
						else if(memcmp(code, "operator", 8) == 0)
							lType = lex_operator;
						break;
					case 9:
						if(memcmp(code, "coroutine", 9) == 0)
							lType = lex_coroutine;
						else if(memcmp(code, "namespace", 9) == 0)
							lType = lex_namespace;
						break;
					case 10:
						if(memcmp(code, "extendable", 10) == 0)
							lType = lex_extendable;
						break;
					}
				}

				if(lType == lex_none)
					lType = lex_string;
			}
		}
		Lexeme lex;

		lex.type = lType;
		lex.length = lLength;

		lex.pos = code;

		lex.line = line;
		lex.column = unsigned(code - lineStart);

		lexems.push_back(lex);

		code += lLength;
		lType = lex_none;
		lLength = 1;
	}

	Lexeme lex;

	lex.type = lex_none;
	lex.length = 1;

	lex.pos = code;

	lex.line = line;
	lex.column = unsigned(code - lineStart);

	lexems.push_back(lex);
}